

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O2

float __thiscall embree::Statistics::getSigma(Statistics *this)

{
  size_t sVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar5;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  
  sVar1 = this->N;
  if (sVar1 != 0) {
    auVar3._8_4_ = (int)(sVar1 >> 0x20);
    auVar3._0_8_ = sVar1;
    auVar3._12_4_ = 0x45300000;
    dVar2 = (double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0;
    dVar5 = auVar3._8_8_ - 1.9342813113834067e+25;
    auVar6._0_8_ = this->v;
    auVar6._8_8_ = this->v2;
    auVar4._0_8_ = dVar2 + dVar5;
    auVar4._8_8_ = dVar2 + dVar5;
    auVar6 = divpd(auVar6,auVar4);
    dVar2 = auVar6._8_8_ - auVar6._0_8_ * auVar6._0_8_;
    if (dVar2 <= 0.0) {
      dVar2 = 0.0;
    }
    return (float)SQRT(dVar2);
  }
  return 0.0;
}

Assistant:

float getSigma() const 
    {
      if (N == 0) return 0.0f;
      else return (float) sqrt(max(0.0,v2/N - sqr(v/N)));
    }